

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O0

bool __thiscall HtmlModelSerialiser::saveModel(HtmlModelSerialiser *this,QIODevice *destination)

{
  QIODevice *pQVar1;
  ulong uVar2;
  QXmlStreamWriter local_38 [8];
  QXmlStreamWriter writer;
  HtmlModelSerialiserPrivate *d;
  QIODevice *local_20;
  QIODevice *destination_local;
  HtmlModelSerialiser *this_local;
  
  if (destination == (QIODevice *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    local_20 = destination;
    destination_local = (QIODevice *)this;
    uVar2 = QIODevice::isOpen();
    pQVar1 = local_20;
    if ((uVar2 & 1) == 0) {
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)((long)&d + 4),WriteOnly);
      uVar2 = (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,d._4_4_);
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = 0;
        goto LAB_0013d2f5;
      }
    }
    uVar2 = QIODevice::isWritable();
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = 0;
    }
    else {
      _writer = d_func(this);
      if ((_writer->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
          m_constModel == (QAbstractItemModel *)0x0) {
        this_local._7_1_ = 0;
      }
      else {
        QXmlStreamWriter::QXmlStreamWriter(local_38,local_20);
        this_local._7_1_ = HtmlModelSerialiserPrivate::writeHtml(_writer,local_38);
        QXmlStreamWriter::~QXmlStreamWriter(local_38);
      }
    }
  }
LAB_0013d2f5:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HtmlModelSerialiser::saveModel(QIODevice *destination) const
{
    if (!destination)
        return false;
    if (!destination->isOpen()) {
        if (!destination->open(QIODevice::WriteOnly))
            return false;
    }
    if (!destination->isWritable())
        return false;
    Q_D(const HtmlModelSerialiser);

    if (!d->m_constModel)
        return false;
    QXmlStreamWriter writer(destination);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    writer.setCodec(textCodec());
#endif
    return d->writeHtml(writer);
}